

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

uLong deflateBound(z_streamp strm,uLong sourceLen)

{
  Bytef BVar1;
  internal_state *piVar2;
  int iVar3;
  long lVar4;
  Bytef *local_40;
  Bytef *str;
  uLong wraplen;
  uLong complen;
  deflate_state *s;
  uLong sourceLen_local;
  z_streamp strm_local;
  
  lVar4 = sourceLen + (sourceLen + 7 >> 3) + (sourceLen + 0x3f >> 6);
  iVar3 = deflateStateCheck(strm);
  if (iVar3 == 0) {
    piVar2 = strm->state;
    iVar3 = piVar2->wrap;
    if (iVar3 == 0) {
      str = (Bytef *)0x0;
    }
    else if (iVar3 == 1) {
      iVar3 = 0;
      if (piVar2->strstart != 0) {
        iVar3 = 4;
      }
      str = (Bytef *)(long)(iVar3 + 6);
    }
    else if (iVar3 == 2) {
      str = (Bytef *)0x12;
      if (piVar2->gzhead != (gz_headerp)0x0) {
        if (piVar2->gzhead->extra != (Bytef *)0x0) {
          str = (Bytef *)((ulong)(piVar2->gzhead->extra_len + 2) + 0x12);
        }
        local_40 = piVar2->gzhead->name;
        if (local_40 != (Bytef *)0x0) {
          do {
            str = str + 1;
            BVar1 = *local_40;
            local_40 = local_40 + 1;
          } while (BVar1 != '\0');
        }
        local_40 = piVar2->gzhead->comment;
        if (local_40 != (Bytef *)0x0) {
          do {
            str = str + 1;
            BVar1 = *local_40;
            local_40 = local_40 + 1;
          } while (BVar1 != '\0');
        }
        if (piVar2->gzhead->hcrc != 0) {
          str = str + 2;
        }
      }
    }
    else {
      str = (Bytef *)0x6;
    }
    if ((piVar2->w_bits == 0xf) && (piVar2->hash_bits == 0xf)) {
      strm_local = (z_streamp)
                   (str + sourceLen + (sourceLen >> 0xc) + (sourceLen >> 0xe) + (sourceLen >> 0x19)
                          + 7);
    }
    else {
      strm_local = (z_streamp)(str + lVar4 + 5);
    }
  }
  else {
    strm_local = (z_streamp)(lVar4 + 0xb);
  }
  return (uLong)strm_local;
}

Assistant:

uLong ZEXPORT deflateBound(strm, sourceLen)
    z_streamp strm;
    uLong sourceLen;
{
    deflate_state *s;
    uLong complen, wraplen;

    /* conservative upper bound for compressed data */
    complen = sourceLen +
              ((sourceLen + 7) >> 3) + ((sourceLen + 63) >> 6) + 5;

    /* if can't get parameters, return conservative bound plus zlib wrapper */
    if (deflateStateCheck(strm))
        return complen + 6;

    /* compute wrapper length */
    s = strm->state;
    switch (s->wrap) {
    case 0:                                 /* raw deflate */
        wraplen = 0;
        break;
    case 1:                                 /* zlib wrapper */
        wraplen = 6 + (s->strstart ? 4 : 0);
        break;
#ifdef GZIP
    case 2:                                 /* gzip wrapper */
        wraplen = 18;
        if (s->gzhead != Z_NULL) {          /* user-supplied gzip header */
            Bytef *str;
            if (s->gzhead->extra != Z_NULL)
                wraplen += 2 + s->gzhead->extra_len;
            str = s->gzhead->name;
            if (str != Z_NULL)
                do {
                    wraplen++;
                } while (*str++);
            str = s->gzhead->comment;
            if (str != Z_NULL)
                do {
                    wraplen++;
                } while (*str++);
            if (s->gzhead->hcrc)
                wraplen += 2;
        }
        break;
#endif
    default:                                /* for compiler happiness */
        wraplen = 6;
    }

    /* if not default parameters, return conservative bound */
    if (s->w_bits != 15 || s->hash_bits != 8 + 7)
        return complen + wraplen;

    /* default settings: return tight bound for that case */
    return sourceLen + (sourceLen >> 12) + (sourceLen >> 14) +
           (sourceLen >> 25) + 13 - 6 + wraplen;
}